

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JITTest.cpp
# Opt level: O2

void __thiscall Microsoft::VisualStudio::CppUnitTestFramework::JITTest::JITAddFunc(JITTest *this)

{
  int iVar1;
  Func fn;
  int local_2c0;
  int result;
  JitRuntime rt;
  X86Assembler as;
  CodeHolder code;
  
  asmjit::JitRuntime::JitRuntime(&rt);
  asmjit::CodeHolder::CodeHolder(&code);
  asmjit::CodeHolder::init(&code,(EVP_PKEY_CTX *)&rt.super_HostRuntime.super_Runtime._codeInfo);
  asmjit::X86Assembler::X86Assembler(&as,&code);
  asmjit::CodeEmitter::emit
            ((CodeEmitter *)&as,0x189,(Operand_ *)(asmjit::x86OpData + 0x480),
             (Operand_ *)(asmjit::x86OpData + 0x4e0));
  asmjit::CodeEmitter::emit
            ((CodeEmitter *)&as,7,(Operand_ *)(asmjit::x86OpData + 0x480),
             (Operand_ *)(asmjit::x86OpData + 0x4f0));
  asmjit::CodeEmitter::emit((CodeEmitter *)&as,0x276);
  iVar1 = (*rt.super_HostRuntime.super_Runtime._vptr_Runtime[2])(&rt,&fn,&code);
  if (iVar1 != 0) {
    Assert::Fail(L"Failed to compile the code.");
  }
  result = (*fn)(100,200);
  local_2c0 = 300;
  Assert::AreEqual<int>(&result,&local_2c0,(wchar_t *)0x0);
  (*rt.super_HostRuntime.super_Runtime._vptr_Runtime[3])(&rt,fn);
  asmjit::X86Assembler::~X86Assembler(&as);
  asmjit::CodeHolder::~CodeHolder(&code);
  asmjit::JitRuntime::~JitRuntime(&rt);
  return;
}

Assistant:

TEST_METHOD(JITAddFunc)
		{
			typedef int (*Func)(int a, int b);

			using namespace asmjit;

			JitRuntime rt;

			CodeHolder code;
			code.init(rt.getCodeInfo());

			X86Assembler as(&code);

#if defined(CENTAURUS_BUILD_WINDOWS)
			as.mov(x86::rax, x86::rcx);
			as.add(x86::rax, x86::rdx);
#elif defined(CENTAURUS_BUILD_LINUX)
            as.mov(x86::rax, x86::rsi);
            as.add(x86::rax, x86::rdi);
#endif
			as.ret();

			Func fn;

			Error err = rt.add(&fn, &code);

			if (err) Assert::Fail(L"Failed to compile the code.");

			int result = fn(100, 200);

			Assert::AreEqual(result, 300);

			rt.release(fn);
		}